

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::ScanLineInputFile::ScanLineInputFile
          (ScanLineInputFile *this,Header *header,IStream *is,int numThreads)

{
  LineOrder LVar1;
  IStream *in;
  bool bVar2;
  int iVar3;
  Data *pDVar4;
  InputStreamMutex *pIVar5;
  pointer puVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  pointer puVar12;
  char b_1 [4];
  char b [4];
  int local_44;
  undefined8 local_40;
  undefined1 local_34 [4];
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__ScanLineInputFile_02fa6d68;
  pDVar4 = (Data *)operator_new(0x168);
  Data::Data(pDVar4,numThreads);
  this->_data = pDVar4;
  pIVar5 = (InputStreamMutex *)operator_new(0x38);
  (pIVar5->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pIVar5->is = (IStream *)0x0;
  *(undefined8 *)((long)&(pIVar5->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pIVar5->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pIVar5->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pIVar5->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  pIVar5->currentPosition = 0;
  this->_streamData = pIVar5;
  pIVar5->is = is;
  iVar3 = (*is->_vptr_IStream[2])(is);
  this->_data->memoryMapped = SUB41(iVar3,0);
  initialize(this,header);
  pDVar4 = this->_data;
  puVar12 = (pDVar4->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  puVar6 = (pDVar4->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar4->version = 0;
  in = this->_streamData->is;
  LVar1 = pDVar4->lineOrder;
  if (puVar12 == puVar6) {
    uVar7 = 0;
  }
  else {
    uVar8 = 0;
    uVar10 = 1;
    do {
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in,puVar6 + uVar8);
      puVar6 = (pDVar4->lineOffsets).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (long)(pDVar4->lineOffsets).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar6 >> 3;
      bVar2 = uVar10 < uVar7;
      uVar8 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar2);
  }
  pDVar4->fileIsComplete = true;
  if (uVar7 != 0) {
    uVar8 = 1;
    uVar10 = 0;
    do {
      uVar9 = uVar8;
      if (puVar6[uVar10] == 0) {
        pDVar4->fileIsComplete = false;
        iVar3 = (*in->_vptr_IStream[5])(in);
        local_40 = CONCAT44(extraout_var,iVar3);
        if ((pDVar4->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (pDVar4->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar11 = 1;
          uVar7 = 0;
          do {
            iVar3 = (*in->_vptr_IStream[5])(in);
            (*in->_vptr_IStream[3])(in,local_34,4);
            (*in->_vptr_IStream[3])(in,&local_44,4);
            Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(in,local_44);
            if (LVar1 == INCREASING_Y) {
              puVar12 = (pDVar4->lineOffsets).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar7;
            }
            else {
              puVar12 = (pDVar4->lineOffsets).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish + ~uVar7;
            }
            *puVar12 = CONCAT44(extraout_var_00,iVar3);
            uVar7 = (ulong)uVar11;
            uVar11 = uVar11 + 1;
          } while (uVar7 < (ulong)((long)(pDVar4->lineOffsets).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pDVar4->lineOffsets).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        (*in->_vptr_IStream[7])(in);
        (*in->_vptr_IStream[6])(in,local_40);
        return;
      }
      uVar8 = (ulong)((int)uVar9 + 1);
      uVar10 = uVar9;
    } while (uVar9 < uVar7);
  }
  return;
}

Assistant:

ScanLineInputFile::ScanLineInputFile
    (const Header &header,
     OPENEXR_IMF_INTERNAL_NAMESPACE::IStream *is,
     int numThreads)
:
    _data (new Data (numThreads)),
    _streamData (new InputStreamMutex())
{
    _streamData->is = is;
    _data->memoryMapped = is->isMemoryMapped();

    try
    {

        initialize(header);
        
        //
        // (TODO) this is nasty - we need a better way of working out what type of file has been used.
        // in any case I believe this constructor only gets used with single part files
        // and 'version' currently only tracks multipart state, so setting to 0 (not multipart) works for us
        //
        
        _data->version=0;
        readLineOffsets (*_streamData->is,
                        _data->lineOrder,
                        _data->lineOffsets,
                        _data->fileIsComplete);
    }
    catch(...)
    {
        if(_data)
        {
           if (!_data->memoryMapped)
           {
              for (size_t i = 0; i < _data->lineBuffers.size(); i++)
              {
                 if( _data->lineBuffers[i] )
                 {
                   EXRFreeAligned(_data->lineBuffers[i]->buffer);
                   _data->lineBuffers[i]->buffer=nullptr;
                 }
              }
           }
        }
        delete _streamData;
        delete _data;
        throw;
    }
}